

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O3

void Aig_ManRegPartitionAdd(Aig_ManPre_t *p,int iReg)

{
  char cVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  char *pcVar5;
  int *piVar6;
  void *pvVar7;
  Vec_Flt_t *pVVar8;
  int iVar9;
  float *pfVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  
  if (p->pfUsedRegs[iReg] == '\0') {
    p->pfUsedRegs[iReg] = '\x01';
    Vec_IntPush(p->vUniques,iReg);
  }
  pVVar4 = p->vFreeVars;
  pcVar5 = p->pfPartVars;
  uVar11 = pVVar4->nSize;
  cVar1 = pcVar5[iReg];
  if ((int)uVar11 < 1) {
    if (cVar1 != '\0') {
      __assert_fail("!p->pfPartVars[iReg]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPartReg.c"
                    ,0xdb,"void Aig_ManRegPartitionAdd(Aig_ManPre_t *, int)");
    }
  }
  else {
    if (cVar1 == '\0') {
      __assert_fail("p->pfPartVars[iReg]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPartReg.c"
                    ,0xd6,"void Aig_ManRegPartitionAdd(Aig_ManPre_t *, int)");
    }
    piVar6 = pVVar4->pArray;
    uVar12 = 1;
    while (piVar6[uVar12 - 1] != iReg) {
      bVar14 = uVar12 == uVar11;
      uVar12 = uVar12 + 1;
      if (bVar14) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPartReg.c"
                      ,0xd8,"void Aig_ManRegPartitionAdd(Aig_ManPre_t *, int)");
      }
    }
    if ((int)uVar12 < (int)uVar11) {
      do {
        piVar6[uVar12 - 1] = piVar6[uVar12];
        uVar12 = uVar12 + 1;
        uVar11 = pVVar4->nSize;
      } while ((int)uVar12 < (int)uVar11);
    }
    pVVar4->nSize = uVar11 - 1;
  }
  pcVar5[iReg] = '\x01';
  Vec_IntPush(p->vRegs,iReg);
  if ((-1 < iReg) && (iReg < p->vMatrix->nSize)) {
    pvVar7 = p->vMatrix->pArray[(uint)iReg];
    iVar9 = *(int *)((long)pvVar7 + 4);
    if (0 < iVar9) {
      lVar13 = 0;
      do {
        iVar2 = *(int *)(*(long *)((long)pvVar7 + 8) + lVar13 * 4);
        if (p->pfPartVars[iVar2] == '\0') {
          p->pfPartVars[iVar2] = '\x01';
          Vec_IntPush(p->vFreeVars,iVar2);
          iVar9 = *(int *)((long)pvVar7 + 4);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < iVar9);
    }
    pVVar8 = p->vPartCost;
    iVar9 = p->vFreeVars->nSize;
    iVar2 = p->vRegs->nSize;
    uVar11 = pVVar8->nSize;
    if (uVar11 == pVVar8->nCap) {
      if ((int)uVar11 < 0x10) {
        if (pVVar8->pArray == (float *)0x0) {
          pfVar10 = (float *)malloc(0x40);
        }
        else {
          pfVar10 = (float *)realloc(pVVar8->pArray,0x40);
        }
        pVVar8->pArray = pfVar10;
        pVVar8->nCap = 0x10;
      }
      else {
        if (pVVar8->pArray == (float *)0x0) {
          pfVar10 = (float *)malloc((ulong)uVar11 << 3);
        }
        else {
          pfVar10 = (float *)realloc(pVVar8->pArray,(ulong)uVar11 << 3);
        }
        pVVar8->pArray = pfVar10;
        pVVar8->nCap = uVar11 * 2;
      }
    }
    else {
      pfVar10 = pVVar8->pArray;
    }
    iVar3 = pVVar8->nSize;
    pVVar8->nSize = iVar3 + 1;
    pfVar10[iVar3] = (float)iVar9 / (float)iVar2;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Aig_ManRegPartitionAdd( Aig_ManPre_t * p, int iReg )
{
    Vec_Int_t * vSupp;
    int RetValue, iVar, i;
    // make sure this is a new variable
//    assert( !p->pfUsedRegs[iReg] );
    if ( !p->pfUsedRegs[iReg] )
    {
        p->pfUsedRegs[iReg] = 1;
        Vec_IntPush( p->vUniques, iReg );
    }
    // remove it from the free variables
    if ( Vec_IntSize(p->vFreeVars) > 0 )
    {
        assert( p->pfPartVars[iReg] );
        RetValue = Vec_IntRemove( p->vFreeVars, iReg );
        assert( RetValue );
    }
    else
        assert( !p->pfPartVars[iReg] );
    // add it to the partition
    p->pfPartVars[iReg] = 1;
    Vec_IntPush( p->vRegs, iReg );
    // add new variables
    vSupp = (Vec_Int_t *)Vec_PtrEntry( p->vMatrix, iReg );
    Vec_IntForEachEntry( vSupp, iVar, i )
    {
        if ( p->pfPartVars[iVar] )
            continue;
        p->pfPartVars[iVar] = 1;
        Vec_IntPush( p->vFreeVars, iVar );
    }
    // add it to the cost
    Vec_FltPush( p->vPartCost, 1.0*Vec_IntSize(p->vFreeVars)/Vec_IntSize(p->vRegs) );
}